

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void CConsole::Con_EvalIf(IResult *pResult,void *pUserData)

{
  long lVar1;
  int iVar2;
  int iVar3;
  CCommand *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long in_FS_OFFSET;
  bool bVar5;
  undefined4 in_stack_ffffffffffffe958;
  int in_stack_ffffffffffffe95c;
  char *in_stack_ffffffffffffe960;
  CConsole *in_stack_ffffffffffffe968;
  CResult *in_stack_ffffffffffffe970;
  bool Condition;
  CCommand *pCommand;
  CConsole *pConsole;
  void *pUserData_local;
  IResult *pResult_local;
  void *pCallbackUserData;
  FCommandCallback pfnCallback;
  CResult Result;
  char aBuf [128];
  
  Result.m_apArgs[0x11] = (char *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (*pResult->_vptr_IResult[4])(pResult,0);
  pCVar4 = FindCommand(in_stack_ffffffffffffe968,in_stack_ffffffffffffe960,in_stack_ffffffffffffe95c
                      );
  if (pCVar4 == (CCommand *)0x0) {
    iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
    str_format(aBuf,0x80,"No such command: \'%s\'.",CONCAT44(extraout_var,iVar2));
    (**(code **)(*pUserData + 200))(pUserData,0,"console",aBuf);
  }
  else {
    pfnCallback = pCVar4->m_pfnCallback;
    pCallbackUserData = pCVar4->m_pUserData;
    TraverseChain((CConsole *)pUserData,&pfnCallback,&pCallbackUserData);
    CResult::CResult(in_stack_ffffffffffffe970);
    (*pfnCallback)(&Result.super_IResult,pCallbackUserData);
    iVar2 = Result.super_IResult.m_Value;
    if (pfnCallback == IntVariableCommand) {
      iVar3 = (*pResult->_vptr_IResult[4])(pResult,2);
      iVar3 = atoi((char *)CONCAT44(extraout_var_00,iVar3));
      bVar5 = iVar2 == iVar3;
    }
    else {
      (*pResult->_vptr_IResult[4])(pResult,2);
      iVar2 = str_comp_nocase(in_stack_ffffffffffffe960,
                              (char *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958))
      ;
      bVar5 = iVar2 == 0;
    }
    (*pResult->_vptr_IResult[4])(pResult,1);
    iVar2 = str_comp(in_stack_ffffffffffffe960,
                     (char *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958));
    if (iVar2 == 0) {
      bVar5 = (bool)(bVar5 ^ 1);
    }
    else {
      (*pResult->_vptr_IResult[4])(pResult,1);
      iVar2 = str_comp(in_stack_ffffffffffffe960,
                       (char *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958));
      if ((iVar2 == 0) || (pfnCallback != StrVariableCommand)) {
        (*pResult->_vptr_IResult[4])(pResult,1);
        iVar2 = str_comp(in_stack_ffffffffffffe960,
                         (char *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958));
        if (iVar2 == 0) {
          iVar2 = (*pResult->_vptr_IResult[4])(pResult,2);
          iVar2 = atoi((char *)CONCAT44(extraout_var_01,iVar2));
          bVar5 = iVar2 < Result.super_IResult.m_Value;
        }
        else {
          (*pResult->_vptr_IResult[4])(pResult,1);
          iVar2 = str_comp(in_stack_ffffffffffffe960,
                           (char *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958));
          if (iVar2 == 0) {
            iVar2 = (*pResult->_vptr_IResult[4])(pResult,2);
            iVar2 = atoi((char *)CONCAT44(extraout_var_02,iVar2));
            bVar5 = Result.super_IResult.m_Value < iVar2;
          }
          else {
            (*pResult->_vptr_IResult[4])(pResult,1);
            iVar2 = str_comp(in_stack_ffffffffffffe960,
                             (char *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958));
            if (iVar2 == 0) {
              iVar2 = (*pResult->_vptr_IResult[4])(pResult,2);
              iVar2 = atoi((char *)CONCAT44(extraout_var_03,iVar2));
              bVar5 = Result.super_IResult.m_Value <= iVar2;
            }
            else {
              (*pResult->_vptr_IResult[4])(pResult,1);
              iVar2 = str_comp(in_stack_ffffffffffffe960,
                               (char *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958)
                              );
              if (iVar2 == 0) {
                iVar2 = (*pResult->_vptr_IResult[4])(pResult,2);
                iVar2 = atoi((char *)CONCAT44(extraout_var_04,iVar2));
                bVar5 = iVar2 <= Result.super_IResult.m_Value;
              }
              else {
                (*pResult->_vptr_IResult[4])(pResult,1);
                iVar2 = str_comp(in_stack_ffffffffffffe960,
                                 (char *)CONCAT44(in_stack_ffffffffffffe95c,
                                                  in_stack_ffffffffffffe958));
                if (iVar2 != 0) {
                  (**(code **)(*pUserData + 200))
                            (pUserData,0,"console","Error: invalid comperator for type integer");
                }
              }
            }
          }
        }
      }
      else {
        (**(code **)(*pUserData + 200))
                  (pUserData,0,"console","Error: invalid comperator for type string");
      }
    }
    iVar2 = IConsole::IResult::NumArguments(pResult);
    if (4 < iVar2) {
      (*pResult->_vptr_IResult[4])(pResult,4);
      iVar2 = str_comp(in_stack_ffffffffffffe960,
                       (char *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958));
      if (iVar2 != 0) {
        (**(code **)(*pUserData + 200))(pUserData,0,"console","Error: expected else");
      }
    }
    if (bVar5) {
      iVar2 = (*pResult->_vptr_IResult[4])(pResult,3);
      (**(code **)(*pUserData + 0x98))(pUserData,iVar2);
    }
    else {
      iVar2 = IConsole::IResult::NumArguments(pResult);
      if (iVar2 == 6) {
        iVar2 = (*pResult->_vptr_IResult[4])(pResult,5);
        (**(code **)(*pUserData + 0x98))(pUserData,iVar2);
      }
    }
    CResult::~CResult((CResult *)0x13ccbb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConsole::Con_EvalIf(IResult *pResult, void *pUserData)
{
	CConsole *pConsole = static_cast<CConsole *>(pUserData);
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(0), pConsole->m_FlagMask);
	char aBuf[128];
	if(!pCommand)
	{
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(0));
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
		return;
	}
	FCommandCallback pfnCallback = pCommand->m_pfnCallback;
	void *pCallbackUserData = pCommand->m_pUserData;
	pConsole->TraverseChain(&pfnCallback, &pCallbackUserData);
	CResult Result;
	pfnCallback(&Result, pCallbackUserData);
	bool Condition = false;
	if(pfnCallback == IntVariableCommand)
		Condition = Result.m_Value == atoi(pResult->GetString(2));
	else
		Condition = !str_comp_nocase(Result.m_aValue, pResult->GetString(2));
	if(!str_comp(pResult->GetString(1), "!="))
		Condition = !Condition;
	else if(str_comp(pResult->GetString(1), "==") && pfnCallback == StrVariableCommand)
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", "Error: invalid comperator for type string");
	else if(!str_comp(pResult->GetString(1), ">"))
		Condition = Result.m_Value > atoi(pResult->GetString(2));
	else if(!str_comp(pResult->GetString(1), "<"))
		Condition = Result.m_Value < atoi(pResult->GetString(2));
	else if(!str_comp(pResult->GetString(1), "<="))
		Condition = Result.m_Value <= atoi(pResult->GetString(2));
	else if(!str_comp(pResult->GetString(1), ">="))
		Condition = Result.m_Value >= atoi(pResult->GetString(2));
	else if(str_comp(pResult->GetString(1), "=="))
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", "Error: invalid comperator for type integer");

	if(pResult->NumArguments() > 4 && str_comp(pResult->GetString(4), "else"))
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", "Error: expected else");

	if(Condition)
		pConsole->ExecuteLine(pResult->GetString(3));
	else if(pResult->NumArguments() == 6)
		pConsole->ExecuteLine(pResult->GetString(5));
}